

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int diffs(double *sig,int N,int D,int s,double *oup)

{
  int iVar1;
  double *C;
  double local_48;
  double sum;
  double *coeff;
  int d;
  int j;
  int i;
  int Noup;
  double *oup_local;
  int s_local;
  int D_local;
  int N_local;
  double *sig_local;
  
  iVar1 = D * s;
  C = (double *)malloc((long)(iVar1 + 1) << 3);
  delds(D,s,C);
  for (d = iVar1; d < N; d = d + 1) {
    local_48 = 0.0;
    for (coeff._4_4_ = s; coeff._4_4_ < iVar1 + 1; coeff._4_4_ = s + coeff._4_4_) {
      local_48 = sig[d - coeff._4_4_] * C[coeff._4_4_] + local_48;
    }
    oup[d - iVar1] = *C * sig[d] + local_48;
  }
  free(C);
  return N - iVar1;
}

Assistant:

int diffs(double *sig, int N, int D,int s, double *oup) {
	int Noup,i,j,d;
	double *coeff;
	double sum;
	/*
	 * diffs output = [ X(t) - X(t-s) ] ^ D where X(t) is the
	 * input timeseries of length N
	 * output is of length N - D*s
	 * 
	 * 
	 * s - seasonal component, D = 1 when seasonal component is present and 0
	 * when it is absent. D >= 2 is rarely needed and in most cases you may want
	 *  to re-analyze data if D >= 2 is needed.
	 * s = 4 (quarterly data), 12 (yearly data) etc.
	 * 
	 * D - Differencing operator. D >= 1 when seasonal component is present
	 * D is usually 1 when you are differencing [ X(t) - X(t-s) ]
	 * D = 2 yields [ X(t) - X(t-s) ] * [ X(t) - X(t-s) ]
	 * see Chapter 9 of Box Jenkins for detrending and deseasoning seasonal data
	 * with trends 
	 */ 
	
	d = D*s;
	coeff = (double*) malloc(sizeof(double) * (d+1));
	delds(D,s,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = s; j < d+1;j+=s) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}
	
	free(coeff);
	
	return Noup;
}